

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O2

double sosqm(double *vec,int N)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar1;
  }
  dVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = dVar3 + vec[uVar1] * vec[uVar1];
  }
  return dVar3;
}

Assistant:

static double sosqm(double *vec, int N) {
	double sos;
	int i;
	sos = 0.0;

	for (i = 0; i < N;++i) {
		sos += (vec[i] * vec[i]);
	}

	return sos;
}